

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::AbstractTransaction::GetWeight(AbstractTransaction *this)

{
  CfdException *this_00;
  int ret;
  size_t weight;
  int local_4c;
  undefined8 local_48;
  undefined1 local_40 [32];
  
  local_48 = 0;
  local_4c = wally_tx_get_weight(this->wally_tx_pointer_);
  if (local_4c == 0) {
    return (uint32_t)local_48;
  }
  local_40._0_8_ = "cfdcore_transaction_common.cpp";
  local_40._8_4_ = 0x254;
  local_40._16_8_ = "GetWeight";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"wally_tx_get_weight NG[{}].",
                    &local_4c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"transaction weight calc error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetWeight() const {
  size_t weight = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_get_weight(tx_pointer, &weight);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_weight NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "transaction weight calc error.");
  }
  return static_cast<uint32_t>(weight);
}